

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImVec2 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  int iVar5;
  char *pcVar6;
  uint in_ECX;
  byte *in_RDX;
  ImGuiContext *in_RSI;
  ImGuiTabBar *in_RDI;
  ImGuiWindow *in_R8;
  bool bVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  float distance_from_edge_y;
  float threshold_y;
  float threshold_x;
  float threshold_base;
  bool undocking_tab;
  float drag_distance_from_edge_x;
  bool single_floating_window_node;
  ImGuiDockNode *node;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_cursor_max_pos;
  bool want_clip_rect;
  ImRect bb;
  ImVec2 pos;
  ImVec2 backup_main_cursor_pos;
  bool tab_contents_visible;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  bool tab_is_new;
  ImGuiTabItem *tab;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  ImGuiMouseButton in_stack_fffffffffffffe40;
  ImGuiItemFlags in_stack_fffffffffffffe44;
  ImGuiMouseButton IVar12;
  undefined4 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  undefined1 repeat;
  ImGuiMouseButton button;
  ImGuiPayload *in_stack_fffffffffffffe50;
  ImGuiWindow *window_00;
  ImRect *in_stack_fffffffffffffe58;
  ImRect *nav_bb_arg;
  char *in_stack_fffffffffffffe60;
  ImGuiID IVar14;
  ImVec2 *pIVar13;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  ImGuiButtonFlags flags_00;
  byte bVar15;
  ImGuiContext *in_stack_fffffffffffffe70;
  ImGuiWindow *in_stack_fffffffffffffe78;
  ImGuiContext *in_stack_fffffffffffffe80;
  ImGuiTabBar *in_stack_fffffffffffffe88;
  ImVec2 local_14c;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  byte local_131;
  float local_130;
  undefined1 local_129;
  ImGuiWindow *local_128;
  uint in_stack_fffffffffffffee0;
  uint col;
  uint flags_01;
  ImVec2 draw_list;
  char *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff04;
  undefined7 in_stack_ffffffffffffff08;
  float local_e8;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float local_dc;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  bool local_a4;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  ImGuiTabBar *in_stack_ffffffffffffff70;
  ImGuiTabItem *local_70;
  float local_64;
  uint local_24;
  byte *local_20;
  bool local_1;
  
  if ((in_RDI->WantLayout & 1U) != 0) {
    TabBarLayout(in_stack_ffffffffffffff70);
  }
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->SkipItems & 1U) == 0) {
    IVar4 = TabBarCalcTabID((ImGuiTabBar *)
                            CONCAT17(in_stack_fffffffffffffe4f,
                                     CONCAT16(in_stack_fffffffffffffe4e,
                                              CONCAT24(in_stack_fffffffffffffe4c,
                                                       in_stack_fffffffffffffe48))),
                            (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    if ((in_RDX == (byte *)0x0) || ((*in_RDX & 1) != 0)) {
      local_24 = in_ECX;
      if ((in_ECX & 0x100000) == 0) {
        local_20 = in_RDX;
        if (in_RDX == (byte *)0x0) {
          local_24 = in_ECX | 0x100000;
        }
      }
      else {
        local_20 = (byte *)0x0;
      }
      IVar10 = TabItemCalcSize((char *)in_stack_fffffffffffffe58,
                               SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
      local_70 = TabBarFindTabByID((ImGuiTabBar *)
                                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),0);
      bVar7 = local_70 == (ImGuiTabItem *)0x0;
      local_64 = IVar10.x;
      if (bVar7) {
        in_stack_fffffffffffffe88 = in_RDI;
        ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)&stack0xffffffffffffff60);
        ImVector<ImGuiTabItem>::push_back
                  ((ImVector<ImGuiTabItem> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (ImGuiTabItem *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_70 = ImVector<ImGuiTabItem>::back(&in_RDI->Tabs);
        local_70->ID = IVar4;
        local_70->Width = local_64;
      }
      iVar5 = ImVector<ImGuiTabItem>::index_from_ptr(&in_RDI->Tabs,local_70);
      in_RDI->LastTabItemIdx = (short)iVar5;
      local_70->ContentWidth = local_64;
      local_a1 = in_RDI->PrevFrameVisible + 1 < pIVar3->FrameCount;
      local_a2 = (in_RDI->Flags & 0x200000U) != 0;
      local_a3 = local_70->LastFrameVisible + 1 < pIVar3->FrameCount;
      local_70->LastFrameVisible = pIVar3->FrameCount;
      local_70->Flags = local_24;
      local_70->Window = in_R8;
      if ((in_RDI->Flags & 0x100000U) == 0) {
        iVar5 = ImGuiTextBuffer::size(&in_RDI->TabsNames);
        local_70->NameOffset = iVar5;
        in_stack_fffffffffffffe78 = (ImGuiWindow *)&in_RDI->TabsNames;
        in_stack_fffffffffffffe70 = in_RSI;
        in_stack_fffffffffffffe80 = in_RSI;
        strlen(&in_RSI->Initialized);
        ImGuiTextBuffer::append
                  ((ImGuiTextBuffer *)in_stack_fffffffffffffe70,
                   (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   in_stack_fffffffffffffe60);
      }
      else {
        local_70->NameOffset = -1;
      }
      IVar14 = (ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      if (((local_a3 & 1) == 0) && ((in_RDI->Flags & 1U) == 0)) {
        local_70->Offset = in_RDI->OffsetNextTab;
        in_RDI->OffsetNextTab =
             local_70->Width + (pIVar3->Style).ItemInnerSpacing.x + in_RDI->OffsetNextTab;
      }
      if (((((local_a3 & 1) != 0) && ((in_RDI->Flags & 2U) != 0)) &&
          (in_RDI->NextSelectedTabId == 0)) &&
         (((local_a1 & 1) == 0 || (in_RDI->SelectedTabId == 0)))) {
        in_RDI->NextSelectedTabId = IVar4;
      }
      if (((local_24 & 2) != 0) && (in_RDI->SelectedTabId != IVar4)) {
        in_RDI->NextSelectedTabId = IVar4;
      }
      local_a4 = in_RDI->VisibleTabId == IVar4;
      if (local_a4) {
        in_RDI->VisibleTabWasSubmitted = true;
      }
      else if ((((in_RDI->SelectedTabId == 0) && ((local_a1 & 1) != 0)) &&
               (in_R8 == (ImGuiWindow *)0x0)) &&
              (((in_RDI->Tabs).Size == 1 && ((in_RDI->Flags & 2U) == 0)))) {
        local_a4 = true;
      }
      if (((local_a3 & 1) == 0) || (((local_a1 & 1) != 0 && (!bVar7)))) {
        if (in_RDI->SelectedTabId == IVar4) {
          local_70->LastFrameSelected = pIVar3->FrameCount;
        }
        local_c0 = (pIVar2->DC).CursorPos;
        nav_bb_arg = &in_RDI->BarRect;
        pIVar13 = &local_d0;
        ImVec2::ImVec2(pIVar13,(float)(int)(local_70->Offset - in_RDI->ScrollingAnim),0.0);
        local_c8 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                               (ImVec2 *)0x22003c);
        (pIVar2->DC).CursorPos = local_c8;
        local_d8 = (pIVar2->DC).CursorPos;
        IVar10 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                             ,(ImVec2 *)0x220088);
        ImRect::ImRect((ImRect *)&local_e8,&local_d8,(ImVec2 *)&stack0xffffffffffffff10);
        flags_00 = CONCAT13(1,(int3)in_stack_fffffffffffffe6c);
        if ((in_RDI->BarRect).Min.x <= local_e8) {
          pIVar1 = &(in_RDI->BarRect).Max;
          flags_00 = CONCAT13(pIVar1->x <= in_stack_ffffffffffffff20 &&
                              in_stack_ffffffffffffff20 != pIVar1->x,(int3)in_stack_fffffffffffffe6c
                             );
        }
        bVar15 = (byte)((uint)flags_00 >> 0x18);
        if (bVar15 != 0) {
          fVar8 = ImMax<float>(local_e8,(in_RDI->BarRect).Min.x);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff04,fVar8,in_stack_ffffffffffffff1c - 1.0);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffefc,(in_RDI->BarRect).Max.x,local_dc);
          PushClipRect((ImVec2 *)in_stack_fffffffffffffe70,
                       (ImVec2 *)CONCAT44(flags_00,in_stack_fffffffffffffe68),
                       SUB81((ulong)pIVar13 >> 0x38,0));
        }
        draw_list = (pIVar2->DC).CursorMaxPos;
        IVar11 = ImRect::GetSize((ImRect *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        ItemSize(pIVar13,(float)((ulong)nav_bb_arg >> 0x20));
        (pIVar2->DC).CursorMaxPos = draw_list;
        bVar7 = ItemAdd((ImRect *)CONCAT44(flags_00,in_stack_fffffffffffffe68),
                        (ImGuiID)((ulong)pIVar13 >> 0x20),nav_bb_arg);
        if (bVar7) {
          flags_01 = 0x44;
          if (((pIVar3->DragDropActive & 1U) != 0) &&
             (bVar7 = ImGuiPayload::IsDataType
                                (in_stack_fffffffffffffe50,
                                 (char *)CONCAT17(in_stack_fffffffffffffe4f,
                                                  CONCAT16(in_stack_fffffffffffffe4e,
                                                           CONCAT24(in_stack_fffffffffffffe4c,
                                                                    in_stack_fffffffffffffe48)))),
             !bVar7)) {
            flags_01 = flags_01 | 0x1000;
          }
          bVar7 = ButtonBehavior((ImRect *)in_stack_fffffffffffffe88,
                                 (ImGuiID)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                                 (bool *)in_stack_fffffffffffffe78,
                                 &in_stack_fffffffffffffe70->Initialized,flags_00);
          if (bVar7) {
            in_RDI->NextSelectedTabId = IVar4;
          }
          col = CONCAT13((in_stack_fffffffffffffee0 & 0x1000000) != 0 || pIVar3->HoveredId == IVar4,
                         (int3)CONCAT22((short)(in_stack_fffffffffffffee0 >> 0x10),
                                        CONCAT11(bVar7,(char)in_stack_fffffffffffffee0)));
          if ((in_stack_fffffffffffffee0 & 0x10000) == 0) {
            SetItemAllowOverlap();
          }
          if (in_R8 == (ImGuiWindow *)0x0) {
            window_00 = (ImGuiWindow *)0x0;
          }
          else {
            window_00 = (ImGuiWindow *)in_R8->DockNode;
          }
          repeat = false;
          local_128 = window_00;
          if (window_00 != (ImGuiWindow *)0x0) {
            bVar7 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)window_00);
            repeat = false;
            if (bVar7) {
              repeat = ((ImVector<ImGuiWindow_*> *)&local_128->Viewport)->Size == 1;
            }
          }
          local_129 = repeat;
          if ((((col & 0x10000) == 0) || ((bool)repeat == false)) ||
             (bVar7 = IsMouseDragging(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c), !bVar7))
          {
            if ((((col & 0x10000) != 0) && ((local_a3 & 1) == 0)) &&
               (bVar7 = IsMouseDragging(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c), bVar7)
               ) {
              local_130 = 0.0;
              if (((pIVar3->DragDropActive & 1U) == 0) &&
                 (((in_RDI->Flags & 1U) != 0 || (in_R8 != (ImGuiWindow *)0x0)))) {
                pIVar13 = &(pIVar3->IO).MouseDelta;
                if ((0.0 < pIVar13->x || pIVar13->x == 0.0) || (local_e8 <= (pIVar3->IO).MousePos.x)
                   ) {
                  if (((0.0 < (pIVar3->IO).MouseDelta.x) &&
                      (in_stack_ffffffffffffff20 < (pIVar3->IO).MousePos.x)) &&
                     (local_130 = (pIVar3->IO).MousePos.x - in_stack_ffffffffffffff20,
                     (in_RDI->Flags & 1U) != 0)) {
                    TabBarQueueChangeTabOrder(in_RDI,local_70,1);
                  }
                }
                else {
                  local_130 = local_e8 - (pIVar3->IO).MousePos.x;
                  if ((in_RDI->Flags & 1U) != 0) {
                    TabBarQueueChangeTabOrder(in_RDI,local_70,-1);
                  }
                }
              }
              if ((in_R8 != (ImGuiWindow *)0x0) && ((in_R8->Flags & 4U) == 0)) {
                local_131 = false;
                if ((pIVar3->DragDropActive & 1U) != 0) {
                  local_131 = (pIVar3->DragDropPayload).SourceId == IVar4;
                }
                if ((bool)local_131 == false) {
                  fVar8 = pIVar3->FontSize;
                  local_13c = fVar8 * 2.2;
                  local_138 = fVar8;
                  fVar9 = ImFabs((pIVar3->IO).MouseDragMaxDistanceAbs[0].x);
                  local_140 = ImClamp<float>((-local_138 + -local_138 + fVar9) * 0.2,0.0,
                                             local_138 * 4.0);
                  local_140 = fVar8 * 1.5 + local_140;
                  local_144 = ImMax<float>(in_stack_ffffffffffffff1c - (pIVar3->IO).MousePos.y,
                                           (pIVar3->IO).MousePos.y - local_dc);
                  if (local_144 < local_140) {
                    if ((local_13c < local_130) &&
                       (((in_RDI->ReorderRequestDir < '\0' &&
                         (iVar5 = ImGuiTabBar::GetTabOrder
                                            ((ImGuiTabBar *)
                                             CONCAT44(in_stack_fffffffffffffe44,
                                                      in_stack_fffffffffffffe40),
                                             (ImGuiTabItem *)
                                             CONCAT44(in_stack_fffffffffffffe3c,
                                                      in_stack_fffffffffffffe38)), iVar5 == 0)) ||
                        (('\0' < in_RDI->ReorderRequestDir &&
                         (iVar5 = ImGuiTabBar::GetTabOrder
                                            ((ImGuiTabBar *)
                                             CONCAT44(in_stack_fffffffffffffe44,
                                                      in_stack_fffffffffffffe40),
                                             (ImGuiTabItem *)
                                             CONCAT44(in_stack_fffffffffffffe3c,
                                                      in_stack_fffffffffffffe38)),
                         iVar5 == (in_RDI->Tabs).Size + -1)))))) {
                      local_131 = 1;
                    }
                  }
                  else {
                    local_131 = 1;
                  }
                }
                if ((local_131 & 1) != 0) {
                  DockContextQueueUndockWindow(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
                  pIVar3->MovingWindow = in_R8;
                  pIVar3->ActiveId = pIVar3->MovingWindow->MoveId;
                  local_14c = ::operator-((ImVec2 *)
                                          CONCAT44(in_stack_fffffffffffffe3c,
                                                   in_stack_fffffffffffffe38),(ImVec2 *)0x2207df);
                  operator-=(&pIVar3->ActiveIdClickOffset,&local_14c);
                }
              }
            }
          }
          else {
            StartMouseMovingWindow(window_00);
          }
          if (((col & 0x10000) == 0) && ((col & 0x1000000) == 0)) {
            if ((local_a4 & 1U) == 0) {
              in_stack_fffffffffffffe40 = 0x24;
              IVar12 = in_stack_fffffffffffffe40;
              if ((local_a2 & 1) != 0) {
                in_stack_fffffffffffffe40 = 0x21;
                IVar12 = in_stack_fffffffffffffe40;
              }
            }
            else {
              in_stack_fffffffffffffe40 = 0x25;
              IVar12 = in_stack_fffffffffffffe40;
              if ((local_a2 & 1) != 0) {
                in_stack_fffffffffffffe40 = 0x23;
                IVar12 = in_stack_fffffffffffffe40;
              }
            }
          }
          else {
            IVar12 = 0x22;
          }
          GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
          button = (ImGuiMouseButton)window_00;
          TabItemBackground((ImDrawList *)draw_list,(ImRect *)IVar11,flags_01,col);
          RenderNavHighlight((ImRect *)draw_list,(ImGuiID)IVar11.y,(ImGuiNavHighlightFlags)IVar11.x)
          ;
          bVar7 = IsItemHovered(in_stack_fffffffffffffe40);
          if ((bVar7) &&
             ((bVar7 = IsMouseClicked(button,(bool)repeat), bVar7 ||
              (bVar7 = IsMouseReleased(1), bVar7)))) {
            in_RDI->NextSelectedTabId = IVar4;
          }
          if (local_20 != (byte *)0x0) {
            ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(IVar12,in_stack_fffffffffffffe40),
                               (void *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                              );
          }
          IVar11.y = in_stack_ffffffffffffff20;
          IVar11.x = in_stack_ffffffffffffff1c;
          bVar7 = TabItemLabelAndCloseButton
                            ((ImDrawList *)IVar10,
                             (ImRect *)CONCAT17(bVar15,in_stack_ffffffffffffff08),
                             (ImGuiTabItemFlags)in_stack_ffffffffffffff04,IVar11,
                             in_stack_fffffffffffffef8,(ImGuiID)draw_list.y,(ImGuiID)draw_list.x);
          if ((bVar7) && (local_20 != (byte *)0x0)) {
            *local_20 = 0;
            TabBarCloseTab(in_RDI,local_70);
          }
          if ((bVar15 & 1) != 0) {
            PopClipRect();
          }
          (pIVar2->DC).CursorPos = local_c0;
          if ((((pIVar3->HoveredId == IVar4) && ((col & 0x10000) == 0)) &&
              (0.5 < pIVar3->HoveredIdNotActiveTimer)) &&
             ((bVar7 = IsItemHovered(in_stack_fffffffffffffe40), bVar7 &&
              ((in_RDI->Flags & 0x20U) == 0)))) {
            pcVar6 = FindRenderedTextEnd(&in_RSI->Initialized,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar6 - (int)in_RSI),in_RSI);
          }
          local_1 = (bool)(local_a4 & 1);
        }
        else {
          if ((bVar15 & 1) != 0) {
            PopClipRect();
          }
          (pIVar2->DC).CursorPos = local_c0;
          local_1 = (bool)(local_a4 & 1);
        }
      }
      else {
        PushItemFlag(in_stack_fffffffffffffe44,SUB41((uint)in_stack_fffffffffffffe40 >> 0x18,0));
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),IVar14,
                in_stack_fffffffffffffe58);
        PopItemFlag();
        local_1 = (bool)(local_a4 & 1);
      }
    }
    else {
      PushItemFlag(in_stack_fffffffffffffe44,SUB41((uint)in_stack_fffffffffffffe40 >> 0x18,0));
      IVar14 = (ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),IVar14,
              in_stack_fffffffffffffe58);
      PopItemFlag();
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}